

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsExecuteBackgroundParse_Experimental
          (DWORD dwBgParseCookie,JsValueRef script,JsSourceContext sourceContext,WCHAR *url,
          JsParseScriptAttributes parseAttributes,JsValueRef parserState,JsValueRef *result)

{
  HRESULT HVar1;
  BGParseManager *this;
  HRESULT hr;
  JsValueRef parserState_local;
  WCHAR *pWStack_28;
  JsParseScriptAttributes parseAttributes_local;
  WCHAR *url_local;
  JsSourceContext sourceContext_local;
  JsValueRef script_local;
  DWORD dwBgParseCookie_local;
  
  pWStack_28 = url;
  url_local = (WCHAR *)sourceContext;
  sourceContext_local = (JsSourceContext)script;
  script_local._0_4_ = dwBgParseCookie;
  this = BGParseManager::GetBGParseManager();
  HVar1 = BGParseManager::GetInputFromCookie
                    (this,(DWORD)script_local,(LPCUTF8 *)0x0,(size_t *)0x0,&stack0xffffffffffffffd8)
  ;
  if (HVar1 == 0) {
    script_local._4_4_ =
         RunScriptWithParserStateCore
                   ((DWORD)script_local,(JsValueRef)sourceContext_local,(JsSourceContext)url_local,
                    pWStack_28,parseAttributes,parserState,false,result);
  }
  else {
    script_local._4_4_ = JsErrorFatal;
  }
  return script_local._4_4_;
}

Assistant:

CHAKRA_API
JsExecuteBackgroundParse_Experimental(
    _In_ DWORD dwBgParseCookie,
    _In_ JsValueRef script,
    _In_ JsSourceContext sourceContext,
    _In_ WCHAR *url,
    _In_ JsParseScriptAttributes parseAttributes,
    _In_ JsValueRef parserState,
    _Out_ JsValueRef *result)
{
    HRESULT hr = BGParseManager::GetBGParseManager()->GetInputFromCookie(dwBgParseCookie, nullptr, nullptr, &url);
    if (hr == S_OK)
    {
        return RunScriptWithParserStateCore(
            dwBgParseCookie,
            script,
            sourceContext,
            url,
            parseAttributes,
            parserState,
            false,
            result
        );
    }
    else
    {
        return JsErrorFatal;
    }
}